

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FICDATADecoder::decode(FICDATADecoder *this,uint8_t *data,size_t len)

{
  undefined8 uVar1;
  long in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<Assimp::FICDATAValue> sVar3;
  shared_ptr<const_Assimp::FIValue> sVar4;
  undefined1 local_48 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_48._16_8_ = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_48 + 0x10),len,in_RCX + len);
  sVar3 = FICDATAValue::create((FICDATAValue *)local_48,(string *)(local_48 + 0x10));
  uVar1 = local_48._8_8_;
  _Var2 = sVar3.super___shared_ptr<Assimp::FICDATAValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  *this = (FICDATADecoder)local_48._0_8_;
  this[1] = (FICDATADecoder)0x0;
  local_48._8_8_ = (pointer)0x0;
  this[1] = (FICDATADecoder)uVar1;
  local_48._0_8_ = (_func_int **)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._16_8_ != &local_28) {
    operator_delete((void *)local_48._16_8_,local_28._0_8_ + 1);
    _Var2._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        return FICDATAValue::create(parseUTF8String(data, len));
    }